

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles2::Functional::eval_dot_vec4(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float res;
  float fVar2;
  float local_20 [4];
  undefined8 local_10;
  float local_8;
  float local_4;
  
  local_10 = *(undefined8 *)(c->in[0].m_data + 1);
  local_8 = c->in[0].m_data[3];
  local_4 = c->in[0].m_data[0];
  local_20[0] = c->in[1].m_data[3];
  local_20[1] = c->in[1].m_data[2];
  local_20[2] = c->in[1].m_data[1];
  local_20[3] = c->in[1].m_data[0];
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + *(float *)((long)&local_10 + lVar1 * 4) * local_20[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }